

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

StructDefinition __thiscall adios2::VariableNT::GetWriteStructDef(VariableNT *this)

{
  VariableBase *pointer;
  StructDefinition *ptr;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  StructDefinition local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pointer = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_30,"in call to VariableNT::StructFieldElementCount",
             (allocator *)&local_f0);
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(int *)(this->m_Variable + 0x28) != 0x10) {
    std::__cxx11::string::string((string *)&local_f0,"bindings::CXX11",&local_f9);
    std::__cxx11::string::string((string *)&local_50,"VariableNT",&local_fa);
    std::__cxx11::string::string((string *)&local_70,"StructFieldElementCount",&local_fb);
    adios2::ToString_abi_cxx11_((DataType)&local_d0);
    std::operator+(&local_b0,"invalid data type ",&local_d0);
    std::operator+(&local_90,&local_b0,", only Struct type supports this API");
    helper::Throw<std::runtime_error>(&local_f0,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  ptr = (StructDefinition *)adios2::core::VariableStruct::GetWriteStructDef();
  StructDefinition::StructDefinition(&local_f8,ptr);
  return (StructDefinition)local_f8.m_StructDefinition;
}

Assistant:

StructDefinition VariableNT::GetWriteStructDef() noexcept
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFieldElementCount");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT",
                                          "StructFieldElementCount",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    core::StructDefinition *CoreSD =
        reinterpret_cast<core::VariableStruct *>(m_Variable)->GetWriteStructDef();
    return StructDefinition(CoreSD);
}